

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

Vec_Ptr_t * Vec_PtrAlloc(int nCap)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  uint uVar3;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  uVar3 = 8;
  if (6 < nCap - 1U) {
    uVar3 = nCap;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = uVar3;
  if (uVar3 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((ulong)uVar3 << 3);
  }
  pVVar1->pArray = ppvVar2;
  return pVVar1;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrAlloc( int nCap )
{
    Vec_Ptr_t * p;
    p = ABC_ALLOC( Vec_Ptr_t, 1 );
    if ( nCap > 0 && nCap < 8 )
        nCap = 8;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( void *, p->nCap ) : NULL;
    return p;
}